

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

string * __thiscall
Corrade::Utility::String::Implementation::stripSuffix
          (string *__return_storage_ptr__,Implementation *this,string *string,
          ArrayView<const_char> suffix)

{
  ArrayView<const_char> string_00;
  bool bVar1;
  ostream *output;
  size_t unaff_RBX;
  ArrayView<const_char> in_stack_ffffffffffffffd0;
  ostream *in_stack_ffffffffffffffe0;
  
  string_00._size = unaff_RBX;
  string_00._data = (char *)in_stack_ffffffffffffffe0;
  bVar1 = endsWith(string_00,in_stack_ffffffffffffffd0);
  if (bVar1) {
    std::__cxx11::string::erase((ulong)this,*(long *)(this + 8) - (long)suffix._data);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
    return __return_storage_ptr__;
  }
  output = Error::defaultOutput();
  Error::Error((Error *)&stack0xffffffffffffffc0,output,(Flags)0x0);
  Debug::operator<<((Debug *)&stack0xffffffffffffffc0,
                    "Utility::String::stripSuffix(): string doesn\'t end with given suffix");
  Error::~Error((Error *)&stack0xffffffffffffffc0);
  abort();
}

Assistant:

std::string stripSuffix(std::string string, const Containers::ArrayView<const char> suffix) {
    CORRADE_ASSERT(endsWith({string.data(), string.size()}, suffix),
        "Utility::String::stripSuffix(): string doesn't end with given suffix", {});
    string.erase(string.size() - suffix.size());
    return string;
}